

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O0

void __thiscall
Potassco::AspifOutput::theoryAtom(AspifOutput *this,Id_t atomOrZero,Id_t termId,IdSpan *elements)

{
  AspifOutput *in_RCX;
  Directive_t in_ESI;
  AtomSpan *in_RDI;
  AspifOutput *unaff_retaddr;
  int x;
  AspifOutput *in_stack_ffffffffffffffe0;
  AtomSpan *atoms;
  
  atoms = in_RDI;
  Directive_t::Directive_t((Directive_t *)&stack0xffffffffffffffe4,Theory);
  x = (int)((ulong)in_RDI >> 0x20);
  startDir(in_RCX,in_ESI);
  add(in_stack_ffffffffffffffe0,x);
  add(in_stack_ffffffffffffffe0,x);
  add(in_stack_ffffffffffffffe0,x);
  add(unaff_retaddr,atoms);
  endDir(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void AspifOutput::theoryAtom(Id_t atomOrZero, Id_t termId, const IdSpan& elements) {
	startDir(Directive_t::Theory).add(Theory_t::Atom).add(atomOrZero).add(termId).add(elements).endDir();
}